

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorRotationAngle.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkMotorRotationAngle::ArchiveIN(ChLinkMotorRotationAngle *this,ChArchiveIn *marchive)

{
  ChArchiveIn::VersionRead<chrono::ChLinkMotorRotationAngle>(marchive);
  ChLinkMotorRotation::ArchiveIN(&this->super_ChLinkMotorRotation,marchive);
  (**(code **)(*(long *)marchive + 0x20))(marchive);
  return;
}

Assistant:

void ChLinkMotorRotationAngle::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChLinkMotorRotationAngle>();

    // deserialize parent class
    ChLinkMotorRotation::ArchiveIN(marchive);

    // deserialize all member data:
    marchive >> CHNVP(rot_offset);
}